

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_ocb.c
# Opt level: O0

int update_iv(PROV_AES_OCB_CTX *ctx)

{
  size_t in_RDI;
  PROV_AES_OCB_CTX *unaff_retaddr;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((*(int *)(in_RDI + 0x360) == 3) || (*(int *)(in_RDI + 0x360) == 0)) {
    iVar1 = 0;
  }
  else {
    if (*(int *)(in_RDI + 0x360) == 1) {
      iVar1 = aes_generic_ocb_setiv
                        (unaff_retaddr,
                         (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,in_stack_ffffffffffffffe8);
      if (iVar1 == 0) {
        return 0;
      }
      *(undefined4 *)(in_RDI + 0x360) = 2;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int update_iv(PROV_AES_OCB_CTX *ctx)
{
    if (ctx->iv_state == IV_STATE_FINISHED
        || ctx->iv_state == IV_STATE_UNINITIALISED)
        return 0;
    if (ctx->iv_state == IV_STATE_BUFFERED) {
        if (!aes_generic_ocb_setiv(ctx, ctx->base.iv, ctx->base.ivlen,
                                   ctx->taglen))
            return 0;
        ctx->iv_state = IV_STATE_COPIED;
    }
    return 1;
}